

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O1

int X509_policy_check(X509_POLICY_TREE **ptree,int *pexplicit_policy,stack_st_X509 *certs,
                     stack_st_ASN1_OBJECT *policy_oids,uint flags)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  X509 *pXVar7;
  OPENSSL_STACK *level;
  OPENSSL_STACK *pOVar8;
  size_t sVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  size_t sVar12;
  OPENSSL_STACK *pOVar13;
  OPENSSL_STACK *pOVar14;
  POLICY_MAPPING *a;
  X509_POLICY_NODE *pXVar15;
  POLICY_CONSTRAINTS *a_00;
  ASN1_INTEGER *skip_certs;
  ASN1_OBJECT *pAVar16;
  void *pvVar17;
  X509_POLICY_LEVEL *level_00;
  ASN1_OBJECT *policy;
  X509_POLICY_NODE *pXVar18;
  byte bVar19;
  size_t sVar20;
  uint uVar21;
  ulong i;
  bool bVar22;
  size_t explicit_policy;
  size_t policy_mapping;
  size_t inhibit_any_policy;
  int local_a4;
  OPENSSL_STACK *local_a0;
  OPENSSL_STACK *local_98;
  X509 *local_90;
  OPENSSL_STACK *local_88;
  OPENSSL_STACK *local_80;
  OPENSSL_STACK *local_78;
  OPENSSL_STACK *local_70;
  OPENSSL_STACK *local_68;
  OPENSSL_STACK *local_60;
  OPENSSL_STACK *local_58;
  ulong local_50;
  OPENSSL_STACK *local_48;
  size_t local_40;
  stack_st_ASN1_OBJECT *local_38;
  
  *(undefined8 *)&policy_oids->stack = 0;
  local_38 = policy_oids;
  sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)ptree);
  if (sVar6 < 2) {
    return 0;
  }
  local_60 = (OPENSSL_STACK *)(sVar6 + 1);
  pOVar8 = (OPENSSL_STACK *)0x0;
  uVar21 = (uint)certs;
  local_68 = (OPENSSL_STACK *)0x0;
  if ((uVar21 >> 8 & 1) == 0) {
    local_68 = local_60;
  }
  local_58 = (OPENSSL_STACK *)0x0;
  if ((uVar21 >> 9 & 1) == 0) {
    local_58 = local_60;
  }
  if ((uVar21 >> 10 & 1) != 0) {
    local_60 = pOVar8;
  }
  local_48 = (OPENSSL_STACK *)pexplicit_policy;
  local_70 = OPENSSL_sk_new_null();
  if (local_70 == (OPENSSL_STACK *)0x0) {
    iVar5 = 0x11;
    level = (OPENSSL_STACK *)0x0;
    goto LAB_00531581;
  }
  sVar20 = sVar6 - 2;
  iVar5 = 0x11;
  level = (OPENSSL_STACK *)0x0;
  local_40 = sVar20;
  do {
    pXVar7 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ptree,sVar20);
    iVar4 = x509v3_cache_extensions((X509 *)pXVar7);
    local_78 = (OPENSSL_STACK *)CONCAT44(local_78._4_4_,2);
    if (iVar4 == 0) goto LAB_00530bb7;
    uVar21 = (pXVar7->ex_data).dummy;
    if (level == (OPENSSL_STACK *)0x0) {
      if (sVar20 != local_40) {
        __assert_fail("i == num_certs - 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                      ,0x2be,
                      "int X509_policy_check(const struct stack_st_X509 *, const struct stack_st_ASN1_OBJECT *, unsigned long, X509 **)"
                     );
      }
      level = (OPENSSL_STACK *)x509_policy_level_new();
      if (level != (OPENSSL_STACK *)0x0) {
        *(int *)&level->data = 1;
        goto LAB_005309c5;
      }
      bVar22 = false;
      level = (OPENSSL_STACK *)0x0;
    }
    else {
LAB_005309c5:
      local_50 = (ulong)((uVar21 & 0x20) >> 5);
      bVar22 = local_58 != (OPENSSL_STACK *)0x0;
      local_98 = (OPENSSL_STACK *)CONCAT71(local_98._1_7_,sVar20 != 0);
      local_90 = pXVar7;
      pOVar8 = (OPENSSL_STACK *)X509_get_ext_d2i(pXVar7,0x59,&local_a4,(int *)0x0);
      if (pOVar8 == (OPENSSL_STACK *)0x0) {
        if (local_a4 == -1) {
          *(int *)&level->data = 0;
          sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)level->num);
          if (sVar9 != 0) {
            sVar9 = 0;
            do {
              pXVar18 = (X509_POLICY_NODE *)OPENSSL_sk_value((OPENSSL_STACK *)level->num,sVar9);
              x509_policy_node_free(pXVar18);
              sVar9 = sVar9 + 1;
              sVar12 = OPENSSL_sk_num((OPENSSL_STACK *)level->num);
            } while (sVar9 < sVar12);
          }
          OPENSSL_sk_zero((OPENSSL_STACK *)level->num);
          goto LAB_00530cf8;
        }
        goto LAB_00530ba2;
      }
      local_80 = (OPENSSL_STACK *)CONCAT71(local_80._1_7_,bVar22);
      sVar9 = OPENSSL_sk_num(pOVar8);
      if (sVar9 == 0) {
        ERR_put_error(0xb,0,0x90,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                      ,0xfa);
LAB_00530b37:
        pOVar13 = (OPENSSL_STACK *)0x0;
LAB_00530b7a:
        OPENSSL_sk_pop_free_ex(pOVar13,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
        CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar8);
LAB_00530ba2:
        *(X509 **)&local_38->stack = local_90;
        iVar5 = 0x2a;
      }
      else {
        local_a0 = level;
        OPENSSL_sk_set_cmp_func(pOVar8,policyinfo_cmp);
        OPENSSL_sk_sort(pOVar8,sk_POLICYINFO_call_cmp_func);
        sVar9 = OPENSSL_sk_num(pOVar8);
        bVar22 = sVar9 != 0;
        if (sVar9 == 0) {
          bVar19 = 0;
        }
        else {
          sVar9 = 0;
          bVar19 = 0;
          do {
            puVar10 = (undefined8 *)OPENSSL_sk_value(pOVar8,sVar9);
            iVar4 = OBJ_obj2nid((ASN1_OBJECT *)*puVar10);
            if (iVar4 == 0x2ea) {
              bVar19 = 1;
            }
            if (sVar9 != 0) {
              puVar11 = (undefined8 *)OPENSSL_sk_value(pOVar8,sVar9 - 1);
              iVar4 = OBJ_cmp((ASN1_OBJECT *)*puVar11,(ASN1_OBJECT *)*puVar10);
              if (iVar4 == 0) {
                ERR_put_error(0xb,0,0x90,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                              ,0x109);
                break;
              }
            }
            sVar9 = sVar9 + 1;
            sVar12 = OPENSSL_sk_num(pOVar8);
            bVar22 = sVar9 < sVar12;
          } while (bVar22);
        }
        level = local_a0;
        if (bVar22) {
          pOVar13 = (OPENSSL_STACK *)0x0;
          goto LAB_00530b7a;
        }
        iVar4 = *(int *)&local_a0->data;
        if ((((byte)local_80 | (byte)local_98 & (byte)local_50) & bVar19) == 0) {
          OPENSSL_sk_delete_if
                    ((OPENSSL_STACK *)local_a0->num,sk_X509_POLICY_NODE_call_delete_if_func,
                     delete_if_not_in_policies,pOVar8);
          *(int *)&level->data = 0;
        }
        if (iVar4 == 0) {
          OPENSSL_sk_pop_free_ex
                    ((OPENSSL_STACK *)0x0,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
          CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar8);
        }
        else {
          pOVar13 = OPENSSL_sk_new_null();
          if (pOVar13 == (OPENSSL_STACK *)0x0) goto LAB_00530b37;
          sVar9 = OPENSSL_sk_num(pOVar8);
          bVar22 = sVar9 != 0;
          if (bVar22) {
            sVar9 = 0;
            do {
              puVar10 = (undefined8 *)OPENSSL_sk_value(pOVar8,sVar9);
              iVar4 = OBJ_obj2nid((ASN1_OBJECT *)*puVar10);
              if ((iVar4 == 0x2ea) ||
                 (pXVar18 = x509_policy_level_find
                                      ((X509_POLICY_LEVEL *)local_a0,(ASN1_OBJECT *)*puVar10),
                 pXVar18 != (X509_POLICY_NODE *)0x0)) {
LAB_00530caf:
                bVar2 = false;
              }
              else {
                pXVar18 = x509_policy_node_new((ASN1_OBJECT *)*puVar10);
                if ((pXVar18 == (X509_POLICY_NODE *)0x0) ||
                   (sVar12 = OPENSSL_sk_push(pOVar13,pXVar18), sVar12 == 0)) {
                  x509_policy_node_free(pXVar18);
                  bVar2 = true;
                  bVar1 = false;
                }
                else {
                  bVar2 = false;
                  bVar1 = true;
                }
                if (bVar1) goto LAB_00530caf;
              }
              if (bVar2) {
                level = local_a0;
                if (bVar22) goto LAB_00530b7a;
                break;
              }
              sVar9 = sVar9 + 1;
              sVar12 = OPENSSL_sk_num(pOVar8);
              bVar22 = sVar9 < sVar12;
            } while (bVar22);
          }
          level = local_a0;
          iVar4 = x509_policy_level_add_nodes
                            ((X509_POLICY_LEVEL *)local_a0,(stack_st_X509_POLICY_NODE *)pOVar13);
          OPENSSL_sk_pop_free_ex(pOVar13,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
          CERTIFICATEPOLICIES_free((CERTIFICATEPOLICIES *)pOVar8);
          if (iVar4 == 0) goto LAB_00530ba2;
        }
LAB_00530cf8:
        if (((local_68 != (OPENSSL_STACK *)0x0) || (*(int *)&level->data != 0)) ||
           (sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)level->num), sVar9 != 0)) {
          sVar9 = OPENSSL_sk_push(local_70,level);
          pOVar8 = local_60;
          if (sVar9 == 0) goto LAB_00530bb7;
          if (sVar20 == 0) {
            cVar3 = '\0';
            level = (OPENSSL_STACK *)0x0;
          }
          else {
            pOVar13 = (OPENSSL_STACK *)X509_get_ext_d2i(local_90,0x2eb,&local_a4,(int *)0x0);
            bVar22 = true;
            if ((pOVar13 == (OPENSSL_STACK *)0x0) && (local_a4 != -1)) {
              pOVar13 = (OPENSSL_STACK *)0x0;
              level = (OPENSSL_STACK *)0x0;
              pOVar8 = (OPENSSL_STACK *)0x0;
            }
            else if (pOVar13 == (OPENSSL_STACK *)0x0) {
              pOVar13 = (OPENSSL_STACK *)0x0;
              local_88 = (OPENSSL_STACK *)0x0;
LAB_005310df:
              if (pOVar13 == (OPENSSL_STACK *)0x0) {
                pOVar13 = OPENSSL_sk_new_null();
                bVar22 = true;
                if (pOVar13 == (OPENSSL_STACK *)0x0) {
                  pOVar13 = (OPENSSL_STACK *)0x0;
                  level = (OPENSSL_STACK *)0x0;
                  pOVar8 = local_88;
                  goto LAB_0053136e;
                }
              }
              local_98 = pOVar13;
              sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)level->num);
              bVar22 = sVar9 != 0;
              local_a0 = level;
              if (bVar22) {
                sVar9 = 0;
                do {
                  puVar10 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)level->num,sVar9);
                  if (*(int *)(puVar10 + 2) == 0) {
                    a = POLICY_MAPPING_new();
                    bVar1 = true;
                    if (a == (POLICY_MAPPING *)0x0) {
LAB_00531193:
                      bVar2 = false;
                    }
                    else {
                      pAVar16 = OBJ_dup((ASN1_OBJECT *)*puVar10);
                      a->issuerDomainPolicy = pAVar16;
                      pAVar16 = OBJ_dup((ASN1_OBJECT *)*puVar10);
                      a->subjectDomainPolicy = pAVar16;
                      if (((a->issuerDomainPolicy == (ASN1_OBJECT *)0x0) ||
                          (pAVar16 == (ASN1_OBJECT *)0x0)) ||
                         (sVar12 = OPENSSL_sk_push(local_98,a), sVar12 == 0)) {
                        POLICY_MAPPING_free(a);
                        goto LAB_00531193;
                      }
                      bVar1 = false;
                      bVar2 = true;
                    }
                    if (bVar2) goto LAB_0053119e;
                  }
                  else {
LAB_0053119e:
                    bVar1 = false;
                  }
                  level = local_a0;
                  if (bVar1) {
                    pOVar13 = local_98;
                    if (bVar22) goto LAB_0053131a;
                    break;
                  }
                  sVar9 = sVar9 + 1;
                  sVar12 = OPENSSL_sk_num((OPENSSL_STACK *)local_a0->num);
                  bVar22 = sVar9 < sVar12;
                } while (bVar22);
              }
              pOVar13 = local_98;
              OPENSSL_sk_set_cmp_func(local_98,compare_subject_policy);
              OPENSSL_sk_sort(pOVar13,sk_POLICY_MAPPING_call_cmp_func);
              pOVar8 = (OPENSSL_STACK *)x509_policy_level_new();
              if (pOVar8 == (OPENSSL_STACK *)0x0) {
LAB_0053131a:
                level = (OPENSSL_STACK *)0x0;
                bVar22 = true;
                pOVar8 = local_88;
              }
              else {
                *(int *)&pOVar8->data = *(int *)&level->data;
                local_80 = pOVar8;
                sVar9 = OPENSSL_sk_num(pOVar13);
                bVar22 = sVar9 != 0;
                if (bVar22) {
                  sVar9 = 0;
                  pXVar18 = (X509_POLICY_NODE *)0x0;
                  do {
                    puVar10 = (undefined8 *)OPENSSL_sk_value(pOVar13,sVar9);
                    if ((*(int *)&local_a0->data == 0) &&
                       (pXVar15 = x509_policy_level_find
                                            ((X509_POLICY_LEVEL *)local_a0,(ASN1_OBJECT *)*puVar10),
                       pXVar15 == (X509_POLICY_NODE *)0x0)) {
                      iVar4 = 0xe;
                    }
                    else {
                      if (((pXVar18 == (X509_POLICY_NODE *)0x0) ||
                          (iVar4 = OBJ_cmp((ASN1_OBJECT *)pXVar18->policy,(ASN1_OBJECT *)puVar10[1])
                          , iVar4 != 0)) &&
                         ((pXVar18 = x509_policy_node_new((ASN1_OBJECT *)puVar10[1]),
                          pXVar18 == (X509_POLICY_NODE *)0x0 ||
                          (sVar12 = OPENSSL_sk_push((OPENSSL_STACK *)local_80->num,pXVar18),
                          sVar12 == 0)))) {
                        x509_policy_node_free(pXVar18);
                      }
                      else {
                        sVar12 = OPENSSL_sk_push((OPENSSL_STACK *)pXVar18->parent_policies,
                                                 (void *)*puVar10);
                        if (sVar12 != 0) {
                          *puVar10 = 0;
                          iVar4 = 0;
                          goto LAB_005312d9;
                        }
                      }
                      iVar4 = 2;
                    }
LAB_005312d9:
                    pOVar13 = local_98;
                    if ((iVar4 != 0xe) && (iVar4 != 0)) {
                      if (bVar22) {
                        bVar22 = true;
                        level = local_80;
                        pOVar8 = local_88;
                        goto LAB_0053136e;
                      }
                      break;
                    }
                    sVar9 = sVar9 + 1;
                    sVar12 = OPENSSL_sk_num(local_98);
                    bVar22 = sVar9 < sVar12;
                  } while (bVar22);
                }
                level = local_80;
                OPENSSL_sk_sort((OPENSSL_STACK *)local_80->num,sk_X509_POLICY_NODE_call_cmp_func);
                bVar22 = false;
                pOVar8 = local_88;
              }
            }
            else {
              sVar9 = OPENSSL_sk_num(pOVar13);
              if (sVar9 == 0) {
                ERR_put_error(0xb,0,0x90,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                              ,0x17b);
                pOVar8 = (OPENSSL_STACK *)0x0;
              }
              else {
                local_80 = pOVar8;
                sVar9 = OPENSSL_sk_num(pOVar13);
                bVar22 = sVar9 != 0;
                local_98 = pOVar13;
                if (bVar22) {
                  puVar10 = (undefined8 *)OPENSSL_sk_value(pOVar13,0);
                  iVar4 = OBJ_obj2nid((ASN1_OBJECT *)*puVar10);
                  if ((iVar4 != 0x2ea) &&
                     (iVar4 = OBJ_obj2nid((ASN1_OBJECT *)puVar10[1]), iVar4 != 0x2ea)) {
                    i = 1;
                    do {
                      pOVar13 = local_98;
                      sVar9 = OPENSSL_sk_num(local_98);
                      bVar22 = i < sVar9;
                      if (!bVar22) goto LAB_00530f1b;
                      puVar10 = (undefined8 *)OPENSSL_sk_value(pOVar13,i);
                      iVar4 = OBJ_obj2nid((ASN1_OBJECT *)*puVar10);
                      if (iVar4 == 0x2ea) break;
                      iVar4 = OBJ_obj2nid((ASN1_OBJECT *)puVar10[1]);
                      i = i + 1;
                    } while (iVar4 != 0x2ea);
                  }
                  pOVar13 = local_98;
                  if (bVar22) {
                    pOVar8 = (OPENSSL_STACK *)0x0;
                    goto LAB_005310d8;
                  }
                }
LAB_00530f1b:
                OPENSSL_sk_set_cmp_func(pOVar13,compare_issuer_policy);
                OPENSSL_sk_sort(pOVar13,sk_POLICY_MAPPING_call_cmp_func);
                if (local_80 == (OPENSSL_STACK *)0x0) {
                  OPENSSL_sk_delete_if
                            ((OPENSSL_STACK *)level->num,sk_X509_POLICY_NODE_call_delete_if_func,
                             delete_if_mapped,pOVar13);
                  OPENSSL_sk_pop_free_ex
                            (pOVar13,sk_POLICY_MAPPING_call_free_func,POLICY_MAPPING_free);
                  pOVar13 = (OPENSSL_STACK *)0x0;
                  local_88 = (OPENSSL_STACK *)0x0;
                  goto LAB_005310df;
                }
                local_88 = OPENSSL_sk_new_null();
                if (local_88 == (OPENSSL_STACK *)0x0) {
                  pOVar8 = (OPENSSL_STACK *)0x0;
                }
                else {
                  sVar9 = OPENSSL_sk_num(pOVar13);
                  if (sVar9 == 0) {
                    bVar19 = 6;
                  }
                  else {
                    pOVar8 = (OPENSSL_STACK *)0x0;
                    pAVar16 = (ASN1_OBJECT *)0x0;
                    do {
                      local_80 = pOVar8;
                      puVar10 = (undefined8 *)OPENSSL_sk_value(pOVar13,(size_t)pOVar8);
                      if ((pAVar16 == (ASN1_OBJECT *)0x0) ||
                         (iVar4 = OBJ_cmp((ASN1_OBJECT *)*puVar10,pAVar16), iVar4 != 0)) {
                        pAVar16 = (ASN1_OBJECT *)*puVar10;
                        pXVar18 = x509_policy_level_find
                                            ((X509_POLICY_LEVEL *)level,(ASN1_OBJECT *)pAVar16);
                        if (pXVar18 == (X509_POLICY_NODE *)0x0) {
                          if (*(int *)&level->data == 0) {
                            bVar19 = 8;
                          }
                          else {
                            pXVar18 = x509_policy_node_new((ASN1_OBJECT *)*puVar10);
                            if ((pXVar18 != (X509_POLICY_NODE *)0x0) &&
                               (sVar9 = OPENSSL_sk_push(local_88,pXVar18), sVar9 != 0))
                            goto LAB_00530fbc;
                            x509_policy_node_free(pXVar18);
                            bVar19 = 2;
                          }
                        }
                        else {
LAB_00530fbc:
                          pXVar18->mapped = 1;
                          bVar19 = 0;
                        }
                      }
                      else {
                        bVar19 = 8;
                      }
                      pOVar13 = local_98;
                      if ((bVar19 & 7) != 0) goto LAB_005310a6;
                      pOVar8 = (OPENSSL_STACK *)((long)&local_80->num + 1);
                      pOVar14 = (OPENSSL_STACK *)OPENSSL_sk_num(local_98);
                    } while (pOVar8 < pOVar14);
                    bVar19 = 6;
                  }
LAB_005310a6:
                  if (bVar19 == 6) {
                    iVar4 = x509_policy_level_add_nodes
                                      ((X509_POLICY_LEVEL *)level,
                                       (stack_st_X509_POLICY_NODE *)local_88);
                    bVar19 = (iVar4 == 0) * '\x02';
                  }
                  pOVar8 = local_88;
                  if (bVar19 == 0) goto LAB_005310df;
                }
              }
LAB_005310d8:
              bVar22 = true;
              level = (OPENSSL_STACK *)0x0;
            }
LAB_0053136e:
            if (bVar22) {
              x509_policy_level_free((X509_POLICY_LEVEL *)level);
              level = (OPENSSL_STACK *)0x0;
            }
            OPENSSL_sk_pop_free_ex(pOVar13,sk_POLICY_MAPPING_call_free_func,POLICY_MAPPING_free);
            OPENSSL_sk_pop_free_ex(pOVar8,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
            cVar3 = (char)local_50;
            if (level == (OPENSSL_STACK *)0x0) {
              level = (OPENSSL_STACK *)0x0;
              goto LAB_00530ba2;
            }
          }
          if (cVar3 == '\0') {
            if (local_68 != (OPENSSL_STACK *)0x0) {
              local_68 = (OPENSSL_STACK *)((long)&local_68[-1].comp + 7);
            }
            if (local_60 != (OPENSSL_STACK *)0x0) {
              local_60 = (OPENSSL_STACK *)((long)&local_60[-1].comp + 7);
            }
            if (local_58 != (OPENSSL_STACK *)0x0) {
              local_58 = (OPENSSL_STACK *)((long)&local_58[-1].comp + 7);
            }
          }
          a_00 = (POLICY_CONSTRAINTS *)X509_get_ext_d2i(local_90,0x191,&local_a4,(int *)0x0);
          if ((a_00 != (POLICY_CONSTRAINTS *)0x0) || (local_a4 == -1)) {
            if (a_00 == (POLICY_CONSTRAINTS *)0x0) {
LAB_00531471:
              skip_certs = (ASN1_INTEGER *)X509_get_ext_d2i(local_90,0x2ec,&local_a4,(int *)0x0);
              if ((skip_certs != (ASN1_INTEGER *)0x0) || (local_a4 == -1)) {
                iVar4 = apply_skip_certs(skip_certs,(size_t *)&local_58);
                ASN1_INTEGER_free((ASN1_INTEGER *)skip_certs);
                if (iVar4 != 0) {
                  local_78 = (OPENSSL_STACK *)((ulong)local_78 & 0xffffffff00000000);
                  bVar22 = true;
                  goto LAB_00530bb9;
                }
              }
            }
            else {
              if (((ASN1_INTEGER *)a_00->requireExplicitPolicy == (ASN1_INTEGER *)0x0) &&
                 (a_00->inhibitPolicyMapping == (ASN1_INTEGER *)0x0)) {
                ERR_put_error(0xb,0,0x90,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                              ,0x22f);
              }
              else {
                iVar4 = apply_skip_certs((ASN1_INTEGER *)a_00->requireExplicitPolicy,
                                         (size_t *)&local_68);
                if (iVar4 != 0) {
                  iVar4 = apply_skip_certs((ASN1_INTEGER *)a_00->inhibitPolicyMapping,
                                           (size_t *)&local_60);
                  POLICY_CONSTRAINTS_free(a_00);
                  if (iVar4 == 0) goto LAB_00530ba2;
                  goto LAB_00531471;
                }
              }
              POLICY_CONSTRAINTS_free(a_00);
            }
          }
          goto LAB_00530ba2;
        }
        iVar5 = 0x2b;
      }
LAB_00530bb7:
      bVar22 = false;
    }
LAB_00530bb9:
    if (!bVar22) goto LAB_00531522;
    sVar20 = sVar20 - 1;
  } while (sVar20 < sVar6);
  local_78 = (OPENSSL_STACK *)CONCAT44(local_78._4_4_,3);
LAB_00531522:
  if ((int)local_78 == 2) {
LAB_0053157f:
    pOVar8 = (OPENSSL_STACK *)0x0;
    goto LAB_00531581;
  }
  if ((int)local_78 != 3) {
    return iVar5;
  }
  if (local_68 == (OPENSSL_STACK *)0x0) {
    if (local_48 == (OPENSSL_STACK *)0x0) {
      pOVar8 = (OPENSSL_STACK *)0x0;
    }
    else {
      pOVar8 = OPENSSL_sk_dup(local_48);
      if (pOVar8 == (OPENSSL_STACK *)0x0) goto LAB_0053157f;
      OPENSSL_sk_set_cmp_func(pOVar8,asn1_object_cmp);
      OPENSSL_sk_sort(pOVar8,sk_ASN1_OBJECT_call_cmp_func);
    }
    if ((pOVar8 != (OPENSSL_STACK *)0x0) && (iVar5 = OPENSSL_sk_is_sorted(pOVar8), iVar5 == 0)) {
      __assert_fail("user_policies == NULL || sk_ASN1_OBJECT_is_sorted(user_policies)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                    ,0x24d,
                    "int has_explicit_policy(struct stack_st_X509_POLICY_LEVEL *, const struct stack_st_ASN1_OBJECT *)"
                   );
    }
    pOVar14 = local_70;
    local_a0 = (OPENSSL_STACK *)OPENSSL_sk_num(local_70);
    pOVar13 = (OPENSSL_STACK *)((long)&local_a0[-1].comp + 7);
    puVar10 = (undefined8 *)OPENSSL_sk_value(pOVar14,(size_t)pOVar13);
    if ((*(int *)(puVar10 + 1) == 0) &&
       (sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar10), sVar6 == 0)) {
      iVar5 = 0x2b;
      goto LAB_00531581;
    }
    sVar6 = OPENSSL_sk_num(pOVar8);
    sVar20 = OPENSSL_sk_num(pOVar8);
    if (sVar20 != 0) {
      iVar5 = 0;
      sVar20 = 0;
      do {
        pAVar16 = (ASN1_OBJECT *)OPENSSL_sk_value(pOVar8,sVar20);
        iVar4 = OBJ_obj2nid(pAVar16);
        if (iVar4 == 0x2ea) goto LAB_00531581;
        sVar20 = sVar20 + 1;
        sVar9 = OPENSSL_sk_num(pOVar8);
      } while (sVar20 < sVar9);
    }
    if ((sVar6 != 0) && (*(int *)(puVar10 + 1) == 0)) {
      sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar10);
      if (sVar6 != 0) {
        sVar6 = 0;
        do {
          pvVar17 = OPENSSL_sk_value((OPENSSL_STACK *)*puVar10,sVar6);
          *(undefined4 *)((long)pvVar17 + 0x14) = 1;
          sVar6 = sVar6 + 1;
          sVar20 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar10);
        } while (sVar6 < sVar20);
      }
      bVar22 = local_a0 != (OPENSSL_STACK *)0x0;
      if (bVar22) {
        do {
          local_78 = pOVar13;
          pXVar7 = (X509 *)OPENSSL_sk_value(local_70,(size_t)pOVar13);
          sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar7->cert_info);
          if (sVar6 != 0) {
            pOVar13 = local_78 + -1;
            sVar6 = 0;
            local_90 = pXVar7;
            do {
              puVar10 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar7->cert_info,sVar6);
              if (*(int *)((long)puVar10 + 0x14) == 0) {
                iVar5 = 0xd;
              }
              else {
                sVar20 = OPENSSL_sk_num((OPENSSL_STACK *)puVar10[1]);
                if (sVar20 == 0) {
                  iVar4 = OPENSSL_sk_find(pOVar8,(size_t *)0x0,(void *)*puVar10,
                                          sk_ASN1_OBJECT_call_cmp_func);
                  iVar5 = 1;
                  if (iVar4 != 0) goto LAB_005317ab;
                }
                else if (local_78 != (OPENSSL_STACK *)0x0) {
                  level_00 = (X509_POLICY_LEVEL *)
                             OPENSSL_sk_value(local_70,(size_t)((long)&pOVar13->comp + 7));
                  sVar20 = OPENSSL_sk_num((OPENSSL_STACK *)puVar10[1]);
                  if (sVar20 != 0) {
                    sVar20 = 0;
                    do {
                      policy = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)puVar10[1],sVar20);
                      pXVar18 = x509_policy_level_find(level_00,policy);
                      if (pXVar18 != (X509_POLICY_NODE *)0x0) {
                        pXVar18->reachable = 1;
                      }
                      sVar20 = sVar20 + 1;
                      sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)puVar10[1]);
                    } while (sVar20 < sVar9);
                  }
                }
                iVar5 = 0;
              }
LAB_005317ab:
              pXVar7 = local_90;
              if ((iVar5 != 0xd) && (iVar5 != 0)) goto LAB_005317fc;
              sVar6 = sVar6 + 1;
              sVar20 = OPENSSL_sk_num((OPENSSL_STACK *)local_90->cert_info);
            } while (sVar6 < sVar20);
          }
          pOVar13 = (OPENSSL_STACK *)((long)&local_78[-1].comp + 7);
          bVar22 = pOVar13 < local_a0;
        } while (bVar22);
      }
LAB_005317fc:
      iVar5 = 0x2b;
      if (bVar22) {
        iVar5 = 0;
      }
      goto LAB_00531581;
    }
  }
  else {
    pOVar8 = (OPENSSL_STACK *)0x0;
  }
  iVar5 = 0;
LAB_00531581:
  x509_policy_level_free((X509_POLICY_LEVEL *)level);
  OPENSSL_sk_free(pOVar8);
  OPENSSL_sk_pop_free_ex(local_70,sk_X509_POLICY_LEVEL_call_free_func,x509_policy_level_free);
  return iVar5;
}

Assistant:

int X509_policy_check(const STACK_OF(X509) *certs,
                      const STACK_OF(ASN1_OBJECT) *user_policies,
                      unsigned long flags, X509 **out_current_cert) {
  *out_current_cert = NULL;
  int ret = X509_V_ERR_OUT_OF_MEM;
  X509_POLICY_LEVEL *level = NULL;
  STACK_OF(X509_POLICY_LEVEL) *levels = NULL;
  STACK_OF(ASN1_OBJECT) *user_policies_sorted = NULL;
  size_t num_certs = sk_X509_num(certs);

  // Skip policy checking if the chain is just the trust anchor.
  if (num_certs <= 1) {
    return X509_V_OK;
  }

  // See RFC 5280, section 6.1.2, steps (d) through (f).
  size_t explicit_policy =
      (flags & X509_V_FLAG_EXPLICIT_POLICY) ? 0 : num_certs + 1;
  size_t inhibit_any_policy =
      (flags & X509_V_FLAG_INHIBIT_ANY) ? 0 : num_certs + 1;
  size_t policy_mapping = (flags & X509_V_FLAG_INHIBIT_MAP) ? 0 : num_certs + 1;

  levels = sk_X509_POLICY_LEVEL_new_null();
  if (levels == NULL) {
    goto err;
  }

  for (size_t i = num_certs - 2; i < num_certs; i--) {
    X509 *cert = sk_X509_value(certs, i);
    if (!x509v3_cache_extensions(cert)) {
      goto err;
    }
    const int is_self_issued = (cert->ex_flags & EXFLAG_SI) != 0;

    if (level == NULL) {
      assert(i == num_certs - 2);
      level = x509_policy_level_new();
      if (level == NULL) {
        goto err;
      }
      level->has_any_policy = 1;
    }

    // RFC 5280, section 6.1.3, steps (d) and (e). |any_policy_allowed| is
    // computed as in step (d.2).
    const int any_policy_allowed =
        inhibit_any_policy > 0 || (i > 0 && is_self_issued);
    if (!process_certificate_policies(cert, level, any_policy_allowed)) {
      ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
      *out_current_cert = cert;
      goto err;
    }

    // RFC 5280, section 6.1.3, step (f).
    if (explicit_policy == 0 && x509_policy_level_is_empty(level)) {
      ret = X509_V_ERR_NO_EXPLICIT_POLICY;
      goto err;
    }

    // Insert into the list.
    if (!sk_X509_POLICY_LEVEL_push(levels, level)) {
      goto err;
    }
    X509_POLICY_LEVEL *current_level = level;
    level = NULL;

    // If this is not the leaf certificate, we go to section 6.1.4. If it
    // is the leaf certificate, we go to section 6.1.5 instead.
    if (i != 0) {
      // RFC 5280, section 6.1.4, steps (a) and (b).
      level = process_policy_mappings(cert, current_level, policy_mapping > 0);
      if (level == NULL) {
        ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
        *out_current_cert = cert;
        goto err;
      }
    }

    // RFC 5280, section 6.1.4, step (h-j) for non-leaves, and section 6.1.5,
    // step (a-b) for leaves. In the leaf case, RFC 5280 says only to update
    // |explicit_policy|, but |policy_mapping| and |inhibit_any_policy| are no
    // longer read at this point, so we use the same process.
    if (i == 0 || !is_self_issued) {
      if (explicit_policy > 0) {
        explicit_policy--;
      }
      if (policy_mapping > 0) {
        policy_mapping--;
      }
      if (inhibit_any_policy > 0) {
        inhibit_any_policy--;
      }
    }
    if (!process_policy_constraints(cert, &explicit_policy, &policy_mapping,
                                    &inhibit_any_policy)) {
      ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
      *out_current_cert = cert;
      goto err;
    }
  }

  // RFC 5280, section 6.1.5, step (g). We do not output the policy set, so it
  // is only necessary to check if the user-constrained-policy-set is not empty.
  if (explicit_policy == 0) {
    // Build a sorted copy of |user_policies| for more efficient lookup.
    if (user_policies != NULL) {
      user_policies_sorted = sk_ASN1_OBJECT_dup(user_policies);
      if (user_policies_sorted == NULL) {
        goto err;
      }
      sk_ASN1_OBJECT_set_cmp_func(user_policies_sorted, asn1_object_cmp);
      sk_ASN1_OBJECT_sort(user_policies_sorted);
    }

    if (!has_explicit_policy(levels, user_policies_sorted)) {
      ret = X509_V_ERR_NO_EXPLICIT_POLICY;
      goto err;
    }
  }

  ret = X509_V_OK;

err:
  x509_policy_level_free(level);
  // |user_policies_sorted|'s contents are owned by |user_policies|, so we do
  // not use |sk_ASN1_OBJECT_pop_free|.
  sk_ASN1_OBJECT_free(user_policies_sorted);
  sk_X509_POLICY_LEVEL_pop_free(levels, x509_policy_level_free);
  return ret;
}